

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2loop.h
# Opt level: O3

S2Point * __thiscall S2Loop::oriented_vertex(S2Loop *this,int i)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  S2LogMessage SStack_18;
  
  if (i < 0) {
    S2LogMessage::S2LogMessage
              (&SStack_18,
               "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2loop.h"
               ,0xbf,kFatal,(ostream *)&std::cerr);
    std::__ostream_insert<char,std::char_traits<char>>
              (SStack_18.stream_,"Check failed: (i) >= (0) ",0x19);
  }
  else {
    iVar1 = this->num_vertices_;
    if (i < iVar1 * 2) {
      uVar2 = i - iVar1;
      if (i - iVar1 < 0) {
        uVar2 = i;
      }
      uVar3 = ~uVar2 + iVar1;
      if ((this->depth_ & 1) == 0) {
        uVar3 = uVar2;
      }
      return this->vertices_ + (int)uVar3;
    }
    S2LogMessage::S2LogMessage
              (&SStack_18,
               "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2loop.h"
               ,0xc0,kFatal,(ostream *)&std::cerr);
    std::__ostream_insert<char,std::char_traits<char>>
              (SStack_18.stream_,"Check failed: (i) < (2 * num_vertices()) ",0x29);
  }
  abort();
}

Assistant:

const S2Point& oriented_vertex(int i) const {
    S2_DCHECK_GE(i, 0);
    S2_DCHECK_LT(i, 2 * num_vertices());
    int j = i - num_vertices();
    if (j < 0) j = i;
    if (is_hole()) j = num_vertices() - 1 - j;
    return vertices_[j];
  }